

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas.c
# Opt level: O0

int IDAGetQuadSens1(void *ida_mem,sunrealtype *ptret,int is,N_Vector yyQSret)

{
  long in_RCX;
  sunrealtype *in_RSI;
  IDAMem in_RDI;
  int retval;
  IDAMem IDA_mem;
  N_Vector in_stack_00000060;
  int in_stack_00000068;
  int in_stack_0000006c;
  sunrealtype in_stack_00000070;
  void *in_stack_00000078;
  int local_4;
  
  if (in_RDI == (IDAMem)0x0) {
    IDAProcessError((IDAMem)0x0,-0x14,0xea8,"IDAGetQuadSens1",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas.c"
                    ,"ida_mem = NULL illegal.");
    local_4 = -0x14;
  }
  else if (in_RDI->ida_sensi == 0) {
    IDAProcessError(in_RDI,-0x28,0xeb1,"IDAGetQuadSens1",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas.c"
                    ,"Illegal attempt to call before calling IDASensInit.");
    local_4 = -0x28;
  }
  else if (in_RDI->ida_quadr_sensi == 0) {
    IDAProcessError(in_RDI,-0x32,0xeb9,"IDAGetQuadSens1",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas.c"
                    ,"Forward sensitivity analysis for quadrature variables was not activated.");
    local_4 = -0x32;
  }
  else if (in_RCX == 0) {
    IDAProcessError(in_RDI,-0x1b,0xec1,"IDAGetQuadSens1",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas.c"
                    ,"dky = NULL illegal.");
    local_4 = -0x1b;
  }
  else {
    *in_RSI = in_RDI->ida_tretlast;
    local_4 = IDAGetQuadSensDky1(in_stack_00000078,in_stack_00000070,in_stack_0000006c,
                                 in_stack_00000068,in_stack_00000060);
  }
  return local_4;
}

Assistant:

int IDAGetQuadSens1(void* ida_mem, sunrealtype* ptret, int is, N_Vector yyQSret)
{
  IDAMem IDA_mem;
  int retval;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  SUNDIALS_MARK_FUNCTION_BEGIN(IDA_PROFILER);

  if (IDA_mem->ida_sensi == SUNFALSE)
  {
    IDAProcessError(IDA_mem, IDA_NO_SENS, __LINE__, __func__, __FILE__,
                    MSG_NO_SENSI);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_NO_SENS);
  }

  if (IDA_mem->ida_quadr_sensi == SUNFALSE)
  {
    IDAProcessError(IDA_mem, IDA_NO_QUADSENS, __LINE__, __func__, __FILE__,
                    MSG_NO_QUADSENSI);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_NO_QUADSENS);
  }

  if (yyQSret == NULL)
  {
    IDAProcessError(IDA_mem, IDA_BAD_DKY, __LINE__, __func__, __FILE__,
                    MSG_NULL_DKY);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_BAD_DKY);
  }

  *ptret = IDA_mem->ida_tretlast;

  retval = IDAGetQuadSensDky1(ida_mem, *ptret, 0, is, yyQSret);

  SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
  return (retval);
}